

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

Literal __thiscall Clasp::PBBuilder::addProduct(PBBuilder *this,LitVec *lits)

{
  bool bVar1;
  Literal LVar2;
  reference pLVar3;
  mapped_type *rhs;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  ProgramBuilder *in_RDI;
  LitVec *in_stack_00000020;
  Literal *eq;
  PKey *in_stack_00000048;
  LitVec *in_stack_00000050;
  PBBuilder *in_stack_00000058;
  key_type *in_stack_ffffffffffffffb8;
  SharedContext *in_stack_ffffffffffffffc0;
  PBBuilder *this_00;
  size_type in_stack_ffffffffffffffdc;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_ffffffffffffffe0;
  mapped_type *pmVar4;
  uint32 local_4;
  
  ProgramBuilder::ctx(in_RDI);
  bVar1 = SharedContext::ok(in_stack_ffffffffffffffc0);
  if (bVar1) {
    this_00 = (PBBuilder *)&in_RDI[1].ctx_;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(in_RSI);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::reserve
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    bVar1 = productSubsumed(in_stack_00000058,in_stack_00000050,in_stack_00000048);
    if (bVar1) {
      pLVar3 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         (in_RSI,0);
      local_4 = pLVar3->rep_;
    }
    else {
      SingleOwnerPtr<Clasp::PBBuilder::ProductIndex,_Clasp::DeleteObject>::operator*
                ((SingleOwnerPtr<Clasp::PBBuilder::ProductIndex,_Clasp::DeleteObject> *)0x1cb8bf);
      rhs = std::
            unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
            ::operator[]((unordered_map<Clasp::PBBuilder::PKey,_Clasp::Literal,_Clasp::PBBuilder::PKey,_Clasp::PBBuilder::PKey,_std::allocator<std::pair<const_Clasp::PBBuilder::PKey,_Clasp::Literal>_>_>
                          *)this_00,in_stack_ffffffffffffffb8);
      pmVar4 = rhs;
      lit_true();
      bVar1 = Clasp::operator!=((Literal *)this_00,rhs);
      if (bVar1) {
        local_4 = pmVar4->rep_;
      }
      else {
        getAuxVar(this_00);
        LVar2 = posLit(0x1cb919);
        pmVar4->rep_ = LVar2.rep_;
        addProductConstraints((PBBuilder *)eq,lits._4_4_,in_stack_00000020);
        local_4 = pmVar4->rep_;
      }
    }
  }
  else {
    local_4 = (uint32)lit_false();
  }
  return (Literal)local_4;
}

Assistant:

Literal PBBuilder::addProduct(LitVec& lits) {
	if (!ctx()->ok()) { return lit_false(); }
	prod_.lits.reserve(lits.size() + 1);
	if (productSubsumed(lits, prod_)){
		return lits[0];
	}
	Literal& eq = (*products_)[prod_];
	if (eq != lit_true()) {
		return eq;
	}
	eq = posLit(getAuxVar());
	addProductConstraints(eq, lits);
	return eq;
}